

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O0

void TMS320C64x_printInst(MCInst *MI,SStream *O,void *Info)

{
  _Bool _Var1;
  MCRegisterInfo *in_stack_00000018;
  SStream *in_stack_00000020;
  MCInst *in_stack_00000028;
  
  _Var1 = printAliasInstruction(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  if (!_Var1) {
    printInstruction(MI,O,(MCRegisterInfo *)Info);
  }
  return;
}

Assistant:

void TMS320C64x_printInst(MCInst *MI, SStream *O, void *Info)
{
	if (!printAliasInstruction(MI, O, Info))
		printInstruction(MI, O, Info);
}